

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_chart_begin_colored
              (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
              float min_value,float max_value)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_rect r;
  nk_rect rect;
  nk_widget_layout_states nVar3;
  nk_chart *__s;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  nk_command_buffer *b;
  float fVar7;
  float fVar8;
  float fVar9;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect local_58;
  int local_48;
  nk_color local_44;
  nk_chart_type local_40;
  nk_color local_3c;
  float local_38;
  float local_34;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.w = 0.0;
  local_58.h = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5d06,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    local_40 = type;
    local_3c = color;
    local_38 = min_value;
    local_34 = max_value;
    if (ctx->current->layout != (nk_panel *)0x0) {
      nVar3 = nk_widget(&local_58,ctx);
      pnVar1 = ctx->current;
      pnVar2 = pnVar1->layout;
      __s = &pnVar2->chart;
      if (nVar3 == NK_WIDGET_INVALID) {
        uVar5 = (ulong)__s & 3;
        if (uVar5 == 0) {
          uVar6 = 0xb4;
        }
        else {
          memset(__s,0,4 - uVar5);
          uVar6 = uVar5 | 0xb0;
          __s = (nk_chart *)((long)__s + (4 - uVar5));
        }
        uVar5 = (ulong)((uint)uVar6 & 0xfffffffc);
        iVar4 = 0;
        memset(__s,0,uVar5);
        if ((uVar6 & 3) != 0) {
          iVar4 = 0;
          memset((void *)((long)__s->slots + (uVar5 - 0x14)),0,uVar6 & 3);
        }
      }
      else {
        uVar5 = (ulong)__s & 3;
        local_48 = count;
        local_44 = highlight;
        if (uVar5 == 0) {
          uVar6 = 0xb4;
        }
        else {
          memset(__s,0,4 - uVar5);
          uVar6 = uVar5 | 0xb0;
          __s = (nk_chart *)((long)__s + (4 - uVar5));
        }
        uVar5 = (ulong)((uint)uVar6 & 0xfffffffc);
        memset(__s,0,uVar5);
        if ((uVar6 & 3) != 0) {
          memset((void *)((long)__s->slots + (uVar5 - 0x14)),0,uVar6 & 3);
        }
        fVar7 = (ctx->style).chart.padding.x;
        (pnVar2->chart).x = local_58.x + fVar7;
        fVar8 = (ctx->style).chart.padding.y;
        (pnVar2->chart).y = local_58.y + fVar8;
        fVar7 = fVar7 + fVar7;
        fVar9 = local_58.w - fVar7;
        (pnVar2->chart).w = fVar9;
        fVar8 = fVar8 + fVar8;
        if (fVar7 <= fVar9) {
          fVar7 = fVar9;
        }
        (pnVar2->chart).w = fVar7;
        if (fVar8 <= local_58.h - fVar8) {
          fVar8 = local_58.h - fVar8;
        }
        (pnVar2->chart).h = fVar8;
        iVar4 = (pnVar2->chart).slot;
        (pnVar2->chart).slot = iVar4 + 1;
        (pnVar2->chart).slots[iVar4].type = local_40;
        (pnVar2->chart).slots[iVar4].count = local_48;
        (pnVar2->chart).slots[iVar4].color = local_3c;
        (pnVar2->chart).slots[iVar4].highlight = local_44;
        fVar7 = local_38;
        if (local_34 <= local_38) {
          fVar7 = local_34;
        }
        (pnVar2->chart).slots[iVar4].min = fVar7;
        fVar8 = local_34;
        if (local_34 <= local_38) {
          fVar8 = local_38;
        }
        (pnVar2->chart).slots[iVar4].max = fVar8;
        (pnVar2->chart).slots[iVar4].range = fVar8 - fVar7;
        b = &pnVar1->buffer;
        if ((ctx->style).chart.background.type == NK_STYLE_ITEM_IMAGE) {
          r.y = local_58.y;
          r.x = local_58.x;
          r.w = local_58.w;
          r.h = local_58.h;
          nk_draw_image(b,r,&(ctx->style).chart.background.data.image,(nk_color)0xffffffff);
        }
        else {
          rect.y = local_58.y;
          rect.x = local_58.x;
          rect.w = local_58.w;
          rect.h = local_58.h;
          nk_fill_rect(b,rect,(ctx->style).chart.rounding,(ctx->style).chart.border_color);
          fVar7 = (ctx->style).chart.border;
          fVar8 = fVar7 + fVar7;
          fVar9 = fVar8;
          if (fVar8 <= local_58.w) {
            fVar9 = local_58.w;
          }
          if (fVar8 <= local_58.h) {
            fVar8 = local_58.h;
          }
          rect_00.x = fVar7 + local_58.x;
          rect_00.y = local_58.y + fVar7;
          rect_00.w = fVar9 + fVar7 * -2.0;
          rect_00.h = fVar7 * -2.0 + fVar8;
          nk_fill_rect(b,rect_00,(ctx->style).chart.rounding,
                       (ctx->style).chart.background.data.color);
        }
        iVar4 = 1;
      }
      return iVar4;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5d08,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x5d07,
                "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
               );
}

Assistant:

NK_API int
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
    struct nk_color color, struct nk_color highlight,
    int count, float min_value, float max_value)
{
    struct nk_window *win;
    struct nk_chart *chart;
    const struct nk_style *config;
    const struct nk_style_chart *style;

    const struct nk_style_item *background;
    struct nk_rect bounds = {0, 0, 0, 0};

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);

    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    if (!nk_widget(&bounds, ctx)) {
        chart = &ctx->current->layout->chart;
        nk_zero(chart, sizeof(*chart));
        return 0;
    }

    win = ctx->current;
    config = &ctx->style;
    chart = &win->layout->chart;
    style = &config->chart;

    /* setup basic generic chart  */
    nk_zero(chart, sizeof(*chart));
    chart->x = bounds.x + style->padding.x;
    chart->y = bounds.y + style->padding.y;
    chart->w = bounds.w - 2 * style->padding.x;
    chart->h = bounds.h - 2 * style->padding.y;
    chart->w = NK_MAX(chart->w, 2 * style->padding.x);
    chart->h = NK_MAX(chart->h, 2 * style->padding.y);

    /* add first slot into chart */
    {struct nk_chart_slot *slot = &chart->slots[chart->slot++];
    slot->type = type;
    slot->count = count;
    slot->color = color;
    slot->highlight = highlight;
    slot->min = NK_MIN(min_value, max_value);
    slot->max = NK_MAX(min_value, max_value);
    slot->range = slot->max - slot->min;}

    /* draw chart background */
    background = &style->background;
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
        nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
            style->rounding, style->background.data.color);
    }
    return 1;
}